

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O2

void __thiscall
amrex::CoordSys::HiFace
          (CoordSys *this,IntVect *point,int dir,Vector<double,_std::allocator<double>_> *loc)

{
  std::vector<double,_std::allocator<double>_>::resize
            (&loc->super_vector<double,_std::allocator<double>_>,3);
  HiFace(this,point,dir,
         (loc->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start);
  return;
}

Assistant:

void
CoordSys::HiFace (const IntVect& point,
                  int            dir,
                  Vector<Real>&   loc) const noexcept
{
    loc.resize(AMREX_SPACEDIM);
    HiFace(point,dir, loc.dataPtr());
}